

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnCatchExpr(BinaryReaderIR *this,Index except_index)

{
  Location local_128;
  Location local_108;
  Var local_e8;
  Catch local_a0;
  Index local_1c;
  BinaryReaderIR *pBStack_18;
  Index except_index_local;
  BinaryReaderIR *this_local;
  
  local_1c = except_index;
  pBStack_18 = this;
  GetLocation(&local_108,this);
  Var::Var(&local_e8,except_index,&local_108);
  Location::Location(&local_128);
  Catch::Catch(&local_a0,&local_e8,&local_128);
  this_local._4_4_ = AppendCatch(this,&local_a0);
  Catch::~Catch(&local_a0);
  Var::~Var(&local_e8);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnCatchExpr(Index except_index) {
  return AppendCatch(Catch(Var(except_index, GetLocation())));
}